

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68000_trap(m68k_info *info)

{
  byte bVar1;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar2;
  
  aVar2._0_4_ = info->ir & 0xf;
  aVar2.reg_pair.reg_1 = 0;
  MCInst_setOpcode(info->inst,0x160);
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
  (info->extension).operands[0].type = M68K_OP_IMM;
  (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
  (info->extension).operands[0].field_0 = aVar2;
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  return;
}

Assistant:

static void d68000_trap(m68k_info *info)
{
	build_absolute_jump_with_immediate(info, M68K_INS_TRAP, 0, info->ir&0xf);
}